

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_lpc_swb.c
# Opt level: O2

int16_t WebRtcIsac_DecorrelateInterVec(double *data,double *out,int16_t bandwidth)

{
  uint uVar1;
  uint uVar2;
  double (*padVar3) [4];
  undefined6 in_register_00000012;
  uint uVar4;
  int iVar5;
  uint uVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  
  iVar5 = (int)CONCAT62(in_register_00000012,bandwidth);
  if (iVar5 == 0xc) {
    uVar2 = 2;
    padVar3 = (double (*) [4])WebRtcIsac_kInterVecDecorrMatUb12;
  }
  else {
    if (iVar5 != 0x10) {
      return -1;
    }
    uVar2 = 4;
    padVar3 = WebRtcIsac_kInterVecDecorrMatUb16;
  }
  for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
    uVar6 = 0;
    pdVar7 = *padVar3;
    for (; uVar6 = uVar6 & 0xffff, uVar6 < uVar2; uVar6 = uVar6 + 1) {
      uVar1 = iVar5 + uVar6 * 4;
      out[uVar1] = 0.0;
      dVar10 = 0.0;
      pdVar8 = data;
      pdVar9 = pdVar7;
      for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
        dVar10 = dVar10 + *pdVar8 * *pdVar9;
        out[uVar1] = dVar10;
        pdVar9 = (double *)((long)pdVar9 + (ulong)(uVar2 * 8));
        pdVar8 = pdVar8 + 4;
      }
      pdVar7 = pdVar7 + 1;
    }
    data = data + 1;
  }
  return 0;
}

Assistant:

int16_t
WebRtcIsac_DecorrelateInterVec(
    const double* data,
    double* out,
    int16_t bandwidth)
{
  int16_t coeffCntr;
  int16_t rowCntr;
  int16_t colCntr;
  const double* decorrMat;
  int16_t interVecDim;

  switch(bandwidth)
  {
    case isac12kHz:
      {
        decorrMat = &WebRtcIsac_kInterVecDecorrMatUb12[0][0];
        interVecDim = UB_LPC_VEC_PER_FRAME;
        break;
      }
    case isac16kHz:
      {
        decorrMat = &WebRtcIsac_kInterVecDecorrMatUb16[0][0];
        interVecDim = UB16_LPC_VEC_PER_FRAME;
        break;
      }
    default:
      return -1;
  }

  //
  // data * decorrMat
  //
  // data is of size 'interVecDim' * 'UB_LPC_ORDER'
  // That is 'interVecDim' of LAR vectors (mean removed)
  // in columns each of dimension 'UB_LPC_ORDER'.
  // matrix is stored column-wise.
  //

  for(coeffCntr = 0; coeffCntr < UB_LPC_ORDER; coeffCntr++)
  {
    for(colCntr = 0; colCntr < interVecDim; colCntr++)
    {
      out[coeffCntr + colCntr * UB_LPC_ORDER] = 0;
      for(rowCntr = 0; rowCntr < interVecDim; rowCntr++)
      {
        out[coeffCntr + colCntr * UB_LPC_ORDER] +=
            data[coeffCntr + rowCntr * UB_LPC_ORDER] *
            decorrMat[rowCntr * interVecDim + colCntr];
      }
    }
  }
  return 0;
}